

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::QGraphicsView(QGraphicsView *this,QWidget *parent)

{
  QGraphicsViewPrivate *this_00;
  QWidget *this_01;
  
  this_00 = (QGraphicsViewPrivate *)operator_new(0x550);
  QGraphicsViewPrivate::QGraphicsViewPrivate(this_00);
  QAbstractScrollArea::QAbstractScrollArea
            ((QAbstractScrollArea *)this,(QAbstractScrollAreaPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_007ee760;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsView_007ee950;
  QAbstractScrollArea::setViewport((QAbstractScrollArea *)this,(QWidget *)0x0);
  QWidget::setAcceptDrops((QWidget *)this,true);
  QWidget::setBackgroundRole((QWidget *)this,Base);
  QWidget::setAttribute((QWidget *)this,WA_InputMethodEnabled,true);
  this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  QWidget::setAttribute(this_01,WA_InputMethodEnabled,true);
  return;
}

Assistant:

QGraphicsView::QGraphicsView(QWidget *parent)
    : QAbstractScrollArea(*new QGraphicsViewPrivate, parent)
{
    setViewport(nullptr);
    setAcceptDrops(true);
    setBackgroundRole(QPalette::Base);
    // Investigate leaving these disabled by default.
    setAttribute(Qt::WA_InputMethodEnabled);
    viewport()->setAttribute(Qt::WA_InputMethodEnabled);
}